

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

bool __thiscall cmListFile::ParseFile(cmListFile *this,char *filename,bool topLevel,cmMakefile *mf)

{
  cmListFileLexer *pcVar1;
  bool bVar2;
  undefined4 uVar3;
  undefined7 extraout_var;
  iterator iVar4;
  long lVar5;
  pointer pcVar6;
  string name;
  cmListFileParser parser;
  value_type vStack_f8;
  allocator local_c5;
  undefined4 local_c4;
  allocator local_c0 [32];
  undefined1 local_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  _Alloc_hider local_80;
  undefined1 auStack_78 [24];
  long local_60;
  pointer pcStack_58;
  pointer local_50;
  pointer pcStack_48;
  cmMakefile *local_38;
  
  bVar2 = cmsys::SystemTools::FileExists(filename);
  if (bVar2) {
    std::__cxx11::string::string((string *)local_a0,filename,(allocator *)&vStack_f8);
    bVar2 = cmsys::SystemTools::FileIsDirectory((string *)local_a0);
    std::__cxx11::string::~string((string *)local_a0);
    if (!bVar2) {
      local_a0._0_8_ = this;
      local_a0._8_8_ = mf;
      local_90._M_allocated_capacity = (size_type)filename;
      local_90._8_8_ = cmListFileLexer_New();
      auStack_78._0_8_ = (pointer)0x0;
      auStack_78._8_8_ = auStack_78._8_8_ & 0xffffffffffffff00;
      local_60 = 0;
      pcStack_58 = (pointer)0x0;
      local_50 = (pointer)0x0;
      pcStack_48 = (pointer)0x0;
      local_80._M_p = (pointer)(auStack_78 + 8);
      bVar2 = cmListFileParser::ParseFile((cmListFileParser *)local_a0);
      uVar3 = (undefined4)CONCAT71(extraout_var,bVar2);
      cmListFileParser::~cmListFileParser((cmListFileParser *)local_a0);
      local_c4 = uVar3;
      if (!topLevel) goto LAB_00360a94;
      pcVar6 = (this->Functions).
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = -(long)pcVar6;
      local_38 = mf;
      do {
        if (pcVar6 == (this->Functions).
                      super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
          lVar5 = (long)&(((this->Functions).
                           super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_cmCommandContext).Name
                  + lVar5;
          if (0x77e < (ulong)-lVar5 && lVar5 != -0x77f) goto LAB_00360d8a;
          pcVar1 = (cmListFileLexer *)(local_a0 + 8);
          local_a0._8_8_ = local_a0._8_8_ & 0xffffffff00000000;
          local_90._M_allocated_capacity = 0;
          auStack_78._0_8_ = (pointer)0x0;
          local_90._8_8_ = pcVar1;
          local_80._M_p = (pointer)pcVar1;
          std::__cxx11::string::string((string *)&vStack_f8,"project",local_c0);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_a0,&vStack_f8.Value);
          std::__cxx11::string::~string((string *)&vStack_f8);
          std::__cxx11::string::string((string *)&vStack_f8,"set",local_c0);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_a0,&vStack_f8.Value);
          std::__cxx11::string::~string((string *)&vStack_f8);
          std::__cxx11::string::string((string *)&vStack_f8,"if",local_c0);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_a0,&vStack_f8.Value);
          std::__cxx11::string::~string((string *)&vStack_f8);
          std::__cxx11::string::string((string *)&vStack_f8,"endif",local_c0);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_a0,&vStack_f8.Value);
          std::__cxx11::string::~string((string *)&vStack_f8);
          std::__cxx11::string::string((string *)&vStack_f8,"else",local_c0);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_a0,&vStack_f8.Value);
          std::__cxx11::string::~string((string *)&vStack_f8);
          std::__cxx11::string::string((string *)&vStack_f8,"elseif",local_c0);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_a0,&vStack_f8.Value);
          std::__cxx11::string::~string((string *)&vStack_f8);
          std::__cxx11::string::string((string *)&vStack_f8,"add_executable",local_c0);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_a0,&vStack_f8.Value);
          std::__cxx11::string::~string((string *)&vStack_f8);
          std::__cxx11::string::string((string *)&vStack_f8,"add_library",local_c0);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_a0,&vStack_f8.Value);
          std::__cxx11::string::~string((string *)&vStack_f8);
          std::__cxx11::string::string((string *)&vStack_f8,"target_link_libraries",local_c0);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_a0,&vStack_f8.Value);
          std::__cxx11::string::~string((string *)&vStack_f8);
          std::__cxx11::string::string((string *)&vStack_f8,"option",local_c0);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_a0,&vStack_f8.Value);
          std::__cxx11::string::~string((string *)&vStack_f8);
          std::__cxx11::string::string((string *)&vStack_f8,"message",local_c0);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_a0,&vStack_f8.Value);
          std::__cxx11::string::~string((string *)&vStack_f8);
          pcVar6 = (this->Functions).
                   super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          goto LAB_00360d50;
        }
        cmsys::SystemTools::LowerCase((string *)local_a0,(string *)pcVar6);
        bVar2 = std::operator==((string *)local_a0,"cmake_minimum_required");
        std::__cxx11::string::~string((string *)local_a0);
        pcVar6 = pcVar6 + 1;
        lVar5 = lVar5 + -0x40;
      } while (!bVar2);
      goto LAB_00360db1;
    }
  }
  local_c4 = 0;
  goto LAB_00360a94;
  while( true ) {
    cmsys::SystemTools::LowerCase(&vStack_f8.Value,(string *)pcVar6);
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_a0,&vStack_f8.Value);
    std::__cxx11::string::~string((string *)&vStack_f8);
    pcVar6 = pcVar6 + 1;
    if ((cmListFileLexer *)iVar4._M_node == pcVar1) break;
LAB_00360d50:
    if (pcVar6 == (this->Functions).
                  super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a0);
      goto LAB_00360db1;
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a0);
LAB_00360d8a:
  local_38->CheckCMP0000 = true;
  cmMakefile::SetPolicyVersion(local_38,"2.4");
LAB_00360db1:
  pcVar6 = (this->Functions).
           super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if (pcVar6 == (this->Functions).
                  super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      local_a0._0_8_ = &local_90;
      local_a0._8_8_ = (cmMakefile *)0x0;
      local_90._M_allocated_capacity = local_90._M_allocated_capacity & 0xffffffffffffff00;
      local_80._M_p = (pointer)0x0;
      auStack_78._0_8_ = (pointer)0x0;
      auStack_78._8_8_ = 0;
      auStack_78._16_8_ = 0;
      std::__cxx11::string::assign(local_a0);
      std::__cxx11::string::string((string *)local_c0,"Project",&local_c5);
      std::__cxx11::string::string((string *)&vStack_f8,(string *)local_c0);
      vStack_f8.Delim = Unquoted;
      vStack_f8.Line = 0;
      std::__cxx11::string::~string((string *)local_c0);
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::push_back
                ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)auStack_78,
                 &vStack_f8);
      std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::insert
                (&this->Functions,
                 (this->Functions).
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_start,(value_type *)local_a0);
      uVar3 = local_c4;
      std::__cxx11::string::~string((string *)&vStack_f8);
      cmListFileFunction::~cmListFileFunction((cmListFileFunction *)local_a0);
      local_c4 = uVar3;
      break;
    }
    cmsys::SystemTools::LowerCase((string *)local_a0,(string *)pcVar6);
    bVar2 = std::operator==((string *)local_a0,"project");
    std::__cxx11::string::~string((string *)local_a0);
    pcVar6 = pcVar6 + 1;
  } while (!bVar2);
LAB_00360a94:
  return SUB41(local_c4,0);
}

Assistant:

bool cmListFile::ParseFile(const char* filename,
                           bool topLevel,
                           cmMakefile *mf)
{
  if(!cmSystemTools::FileExists(filename) ||
     cmSystemTools::FileIsDirectory(filename))
    {
    return false;
    }

  bool parseError = false;

  {
  cmListFileParser parser(this, mf, filename);
  parseError = !parser.ParseFile();
  }

  // do we need a cmake_policy(VERSION call?
  if(topLevel)
  {
    bool hasVersion = false;
    // search for the right policy command
    for(std::vector<cmListFileFunction>::iterator i
          = this->Functions.begin();
        i != this->Functions.end(); ++i)
    {
      if (cmSystemTools::LowerCase(i->Name) == "cmake_minimum_required")
      {
        hasVersion = true;
        break;
      }
    }
    // if no policy command is found this is an error if they use any
    // non advanced functions or a lot of functions
    if(!hasVersion)
    {
      bool isProblem = true;
      if (this->Functions.size() < 30)
      {
        // the list of simple commands DO NOT ADD TO THIS LIST!!!!!
        // these commands must have backwards compatibility forever and
        // and that is a lot longer than your tiny mind can comprehend mortal
        std::set<std::string> allowedCommands;
        allowedCommands.insert("project");
        allowedCommands.insert("set");
        allowedCommands.insert("if");
        allowedCommands.insert("endif");
        allowedCommands.insert("else");
        allowedCommands.insert("elseif");
        allowedCommands.insert("add_executable");
        allowedCommands.insert("add_library");
        allowedCommands.insert("target_link_libraries");
        allowedCommands.insert("option");
        allowedCommands.insert("message");
        isProblem = false;
        for(std::vector<cmListFileFunction>::iterator i
              = this->Functions.begin();
            i != this->Functions.end(); ++i)
        {
          std::string name = cmSystemTools::LowerCase(i->Name);
          if (allowedCommands.find(name) == allowedCommands.end())
          {
            isProblem = true;
            break;
          }
        }
      }

      if (isProblem)
      {
      // Tell the top level cmMakefile to diagnose
      // this violation of CMP0000.
      mf->SetCheckCMP0000(true);

      // Implicitly set the version for the user.
      mf->SetPolicyVersion("2.4");
      }
    }
  }

  if(topLevel)
    {
    bool hasProject = false;
    // search for a project command
    for(std::vector<cmListFileFunction>::iterator i
          = this->Functions.begin();
        i != this->Functions.end(); ++i)
      {
      if(cmSystemTools::LowerCase(i->Name) == "project")
        {
        hasProject = true;
        break;
        }
      }
    // if no project command is found, add one
    if(!hasProject)
      {
      cmListFileFunction project;
      project.Name = "PROJECT";
      cmListFileArgument prj("Project", cmListFileArgument::Unquoted, 0);
      project.Arguments.push_back(prj);
      this->Functions.insert(this->Functions.begin(),project);
      }
    }
  if(parseError)
    {
    return false;
    }
  return true;
}